

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O2

void __thiscall
flatbuffers::lobster::LobsterGenerator::GenStruct
          (LobsterGenerator *this,StructDef *struct_def,string *code_ptr)

{
  byte bVar1;
  pointer ppFVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if ((struct_def->super_Definition).generated == false) {
    CheckNameSpace(this,&struct_def->super_Definition,code_ptr);
    GenComment(&(struct_def->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"");
    EscapeKeyword(&local_a0,this,(string *)struct_def);
    std::operator+(&local_e0,"class ",&local_a0);
    std::operator+(&local_c0,&local_e0," : flatbuffers.handle\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_a0);
    for (ppFVar2 = (struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppFVar2 !=
        (struct_def->fields).vec.
        super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
        _M_impl.super__Vector_impl_data._M_finish; ppFVar2 = ppFVar2 + 1) {
      if ((*ppFVar2)->deprecated == false) {
        GenStructAccessor(this,struct_def,*ppFVar2,code_ptr);
      }
    }
    std::__cxx11::string::append((char *)code_ptr);
    bVar1 = struct_def->fixed;
    if ((bool)bVar1 == false) {
      EscapeKeyword(&local_40,this,(string *)struct_def);
      std::operator+(&local_60,"def GetRootAs",&local_40);
      std::operator+(&local_a0,&local_60,"(buf:string): return ");
      EscapeKeyword(&local_80,this,(string *)struct_def);
      std::operator+(&local_e0,&local_a0,&local_80);
      std::operator+(&local_c0,&local_e0," { buf, flatbuffers.indirect(buf, 0) }\n\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
      bVar1 = struct_def->fixed;
    }
    if ((bVar1 & 1) == 0) {
      GenTableBuilders(this,struct_def,code_ptr);
    }
    else {
      GenStructBuilder(this,struct_def,code_ptr);
    }
  }
  return;
}

Assistant:

void GenStruct(const StructDef &struct_def, std::string *code_ptr) {
    if (struct_def.generated) return;
    std::string &code = *code_ptr;
    CheckNameSpace(struct_def, &code);
    GenComment(struct_def.doc_comment, code_ptr, nullptr, "");
    code += "class " + NormalizedName(struct_def) + " : flatbuffers.handle\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;
      GenStructAccessor(struct_def, field, code_ptr);
    }
    code += "\n";
    if (!struct_def.fixed) {
      // Generate a special accessor for the table that has been declared as
      // the root type.
      code += "def GetRootAs" + NormalizedName(struct_def) +
              "(buf:string): return " + NormalizedName(struct_def) +
              " { buf, flatbuffers.indirect(buf, 0) }\n\n";
    }
    if (struct_def.fixed) {
      // create a struct constructor function
      GenStructBuilder(struct_def, code_ptr);
    } else {
      // Create a set of functions that allow table construction.
      GenTableBuilders(struct_def, code_ptr);
    }
  }